

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

void __thiscall
duckdb::Deserializer::ReadProperty<duckdb::vector<long,true>>
          (Deserializer *this,field_id_t field_id,char *tag,vector<long,_true> *ret)

{
  undefined6 in_register_00000032;
  _Vector_base<long,_std::allocator<long>_> local_30;
  
  (*this->_vptr_Deserializer[2])(this,CONCAT62(in_register_00000032,field_id));
  Read<duckdb::vector<long,true>>((type *)&local_30,this);
  ::std::vector<long,_std::allocator<long>_>::_M_move_assign
            (&ret->super_vector<long,_std::allocator<long>_>,&local_30);
  ::std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_30);
  (*this->_vptr_Deserializer[3])(this);
  return;
}

Assistant:

inline void ReadProperty(const field_id_t field_id, const char *tag, T &ret) {
		OnPropertyBegin(field_id, tag);
		ret = Read<T>();
		OnPropertyEnd();
	}